

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O0

void __thiscall
kj::anon_unknown_30::OwnedFileDescriptor::OwnedFileDescriptor
          (OwnedFileDescriptor *this,int fd,uint flags)

{
  uint uVar1;
  Fault local_38;
  Fault f_1;
  Fault local_20;
  Fault f;
  uint flags_local;
  int fd_local;
  OwnedFileDescriptor *this_local;
  
  this->fd = fd;
  this->flags = flags;
  f.exception._0_4_ = flags;
  f.exception._4_4_ = fd;
  if ((flags & 4) == 0) {
    setNonblocking(fd);
  }
  else {
    uVar1 = fcntl(fd,3);
    if ((uVar1 & 0x800) == 0) {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[46]>
                (&local_20,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++"
                 ,0x5f,FAILED,"fcntl(fd, F_GETFL) & O_NONBLOCK",
                 "\"You claimed you set NONBLOCK, but you didn\'t.\"",
                 (char (*) [46])"You claimed you set NONBLOCK, but you didn\'t.");
      _::Debug::Fault::fatal(&local_20);
    }
  }
  if (((uint)f.exception & 1) != 0) {
    if (((uint)f.exception & 2) == 0) {
      setCloseOnExec(f.exception._4_4_);
    }
    else {
      uVar1 = fcntl(f.exception._4_4_,1);
      if ((uVar1 & 1) == 0) {
        _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[45]>
                  (&local_38,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++"
                   ,0x67,FAILED,"fcntl(fd, F_GETFD) & FD_CLOEXEC",
                   "\"You claimed you set CLOEXEC, but you didn\'t.\"",
                   (char (*) [45])"You claimed you set CLOEXEC, but you didn\'t.");
        _::Debug::Fault::fatal(&local_38);
      }
    }
  }
  return;
}

Assistant:

OwnedFileDescriptor(int fd, uint flags): fd(fd), flags(flags) {
    if (flags & LowLevelAsyncIoProvider::ALREADY_NONBLOCK) {
      KJ_DREQUIRE(fcntl(fd, F_GETFL) & O_NONBLOCK, "You claimed you set NONBLOCK, but you didn't.");
    } else {
      setNonblocking(fd);
    }

    if (flags & LowLevelAsyncIoProvider::TAKE_OWNERSHIP) {
      if (flags & LowLevelAsyncIoProvider::ALREADY_CLOEXEC) {
        KJ_DREQUIRE(fcntl(fd, F_GETFD) & FD_CLOEXEC,
                    "You claimed you set CLOEXEC, but you didn't.");
      } else {
        setCloseOnExec(fd);
      }
    }
  }